

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::AddSource(cmGeneratorTarget *this,string *src)

{
  undefined1 auVar1 [8];
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  auto_ptr<cmCompiledGeneratorExpression> local_a8;
  undefined1 local_a0 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  
  cmTarget::AddSource(this->Target,src);
  cmMakefile::GetBacktrace(&lfbt,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression(&ge,&lfbt);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a0,(string *)&ge);
  auVar1 = local_a0;
  local_a0 = (undefined1  [8])0x0;
  cge.x_ = (cmCompiledGeneratorExpression *)auVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_a0);
  *(bool *)((long)auVar1 + 0x198) = true;
  local_a0 = (undefined1  [8])operator_new(0x10);
  cge.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_a8.x_ = (cmCompiledGeneratorExpression *)0x0;
  *(undefined1 (*) [8])local_a0 = auVar1;
  *(cmLinkImplItem **)((long)local_a0 + 8) = &TargetPropertyEntry::NoLinkImplItem;
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
  ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
            ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
              *)&this->SourceEntries,(TargetPropertyEntry **)local_a0);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::clear(&(this->SourceFilesMap)._M_t);
  this->LinkImplementationLanguageIsContextDependent = true;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  cmListFileBacktrace::~cmListFileBacktrace(&lfbt);
  return;
}

Assistant:

void cmGeneratorTarget::AddSource(const std::string& src)
{
  this->Target->AddSource(src);
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  this->SourceEntries.push_back(
                        new TargetPropertyEntry(cge));
  this->SourceFilesMap.clear();
  this->LinkImplementationLanguageIsContextDependent = true;
}